

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

int nn_ws_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  size_t local_58;
  nn_optset *local_40;
  nn_ws_optset *optset;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  nn_optset *self_local;
  
  local_40 = self;
  if (self == (nn_optset *)0x0) {
    local_40 = (nn_optset *)0x0;
  }
  if (option == 1) {
    if (*optvallen < 4) {
      local_58 = *optvallen;
    }
    else {
      local_58 = 4;
    }
    memcpy(optval,local_40 + 1,local_58);
    *optvallen = 4;
    self_local._4_4_ = 0;
  }
  else {
    self_local._4_4_ = -0x5c;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_ws_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ws_optset *optset;

    optset = nn_cont (self, struct nn_ws_optset, base);

    switch (option) {
    case NN_WS_MSG_TYPE:
        memcpy (optval, &optset->msg_type,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}